

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void PhyloTree::getCommonEdges
               (PhyloTree *t1,PhyloTree *t2,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  pointer pPVar1;
  bool bVar2;
  int originalID;
  pointer this;
  pointer this_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t1_edges;
  int local_10c;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_108;
  double local_100;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_f8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_d8;
  double local_b8;
  double local_b0;
  PhyloTreeEdge *local_a8;
  Bipartition local_a0;
  PhyloTreeEdge local_78;
  
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)dest;
  getEdges(t1,&local_d8);
  getEdges(t2,&local_f8);
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pPVar1 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
         super__Vector_impl_data._M_start;
  this_00 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    b = &(this->super_Bipartition).partition;
    while( true ) {
      if ((this_00 == pPVar1) || (this == local_a8)) {
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_f8);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_d8);
        return;
      }
      a = &(this_00->super_Bipartition).partition;
      bVar2 = boost::operator<(a,b);
      if (!bVar2) break;
      bVar2 = PhyloTreeEdge::isCompatibleWith(this_00,&local_f8);
      if (bVar2) {
        PhyloTreeEdge::asSplit(&local_78.super_Bipartition,this_00);
        local_100 = PhyloTreeEdge::getAttribute(this_00);
        local_10c = PhyloTreeEdge::getOriginalID(this_00);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (local_108,&local_78.super_Bipartition,&local_100,&local_10c);
        Bipartition::~Bipartition(&local_78.super_Bipartition);
      }
      this_00 = this_00 + 1;
    }
    bVar2 = boost::operator<(b,a);
    if (bVar2) {
      bVar2 = PhyloTreeEdge::isCompatibleWith(this,&local_d8);
      if (bVar2) {
        PhyloTreeEdge::asSplit(&local_78.super_Bipartition,this);
        local_100 = PhyloTreeEdge::getAttribute(this);
        local_10c = PhyloTreeEdge::getOriginalID(this);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (local_108,&local_78.super_Bipartition,&local_100,&local_10c);
        Bipartition::~Bipartition(&local_78.super_Bipartition);
      }
    }
    else {
      PhyloTreeEdge::asSplit(&local_a0,this_00);
      local_b0 = PhyloTreeEdge::getLength(this_00);
      local_b8 = PhyloTreeEdge::getLength(this);
      originalID = PhyloTreeEdge::getOriginalID(this_00);
      PhyloTreeEdge::PhyloTreeEdge(&local_78,&local_a0,local_b0 - local_b8,originalID);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_back<PhyloTreeEdge>
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
      PhyloTreeEdge::~PhyloTreeEdge(&local_78);
      Bipartition::~Bipartition(&local_a0);
      this_00 = this_00 + 1;
    }
    this = this + 1;
  } while( true );
}

Assistant:

void PhyloTree::getCommonEdges(PhyloTree &t1, PhyloTree &t2, vector<PhyloTreeEdge> &dest) {
    vector<PhyloTreeEdge> t1_edges;
    vector<PhyloTreeEdge> t2_edges;
    t1.getEdges(t1_edges);
    t2.getEdges(t2_edges);
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}